

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O2

Database_Result * __thiscall
Database::Query(Database_Result *__return_storage_ptr__,Database *this,char *format,...)

{
  char cVar1;
  char *__s;
  char in_AL;
  size_t sVar2;
  void *pvVar3;
  long lVar4;
  uint *puVar5;
  undefined8 uVar6;
  undefined8 *puVar7;
  undefined8 in_RCX;
  ulong uVar8;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  undefined8 in_R8;
  undefined8 in_R9;
  char *pcVar9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  allocator<char> local_149;
  va_list ap;
  string finalquery;
  string local_108;
  undefined1 local_e8 [24];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if (this->connected == false) {
    puVar7 = (undefined8 *)__cxa_allocate_exception(0x10);
    puVar7[1] = "Not connected to database.";
    *puVar7 = &PTR__exception_001bc518;
    __cxa_throw(puVar7,&Database_QueryFailed::typeinfo,std::exception::~exception);
  }
  ap[0].reg_save_area = local_e8;
  ap[0].overflow_arg_area = &stack0x00000008;
  finalquery._M_dataplus._M_p = (pointer)&finalquery.field_2;
  finalquery._M_string_length = 0;
  ap[0].gp_offset = 0x18;
  ap[0].fp_offset = 0x30;
  finalquery.field_2._M_local_buf[0] = '\0';
  pcVar9 = format;
  do {
    cVar1 = *pcVar9;
    if (cVar1 == '#') {
      uVar8 = ap[0]._0_8_ & 0xffffffff;
      if (uVar8 < 0x29) {
        ap[0].gp_offset = ap[0].gp_offset + 8;
        puVar5 = (uint *)(uVar8 + (long)ap[0].reg_save_area);
      }
      else {
        puVar5 = (uint *)ap[0].overflow_arg_area;
        ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
      }
      util::to_string_abi_cxx11_(&local_108,(util *)(ulong)*puVar5,(int)format);
      std::__cxx11::string::append((string *)&finalquery);
LAB_00124a6b:
      std::__cxx11::string::~string((string *)&local_108);
      format = extraout_RDX_01;
    }
    else if (cVar1 == '$') {
      uVar8 = ap[0]._0_8_ & 0xffffffff;
      if (uVar8 < 0x29) {
        ap[0].gp_offset = ap[0].gp_offset + 8;
        puVar7 = (undefined8 *)(uVar8 + (long)ap[0].reg_save_area);
      }
      else {
        puVar7 = (undefined8 *)ap[0].overflow_arg_area;
        ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
      }
      __s = (char *)*puVar7;
      if (this->engine == SQLite) {
        uVar6 = sqlite3_mprintf("%q",__s);
        std::__cxx11::string::append((char *)&finalquery);
        sqlite3_free(uVar6);
        format = extraout_RDX_02;
      }
      else if (this->engine == MySQL) {
        sVar2 = strlen(__s);
        pvVar3 = operator_new__((long)((int)sVar2 * 2 + 1));
        lVar4 = mysql_real_escape_string
                          (((this->impl)._M_t.
                            super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                            .super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl)->field_0,
                           pvVar3,__s,(long)(int)sVar2);
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_108,pvVar3,(long)pvVar3 + lVar4);
        std::__cxx11::string::append((string *)&finalquery);
        std::__cxx11::string::~string((string *)&local_108);
        operator_delete__(pvVar3);
        format = extraout_RDX_00;
      }
    }
    else {
      if (cVar1 == '@') {
        uVar8 = ap[0]._0_8_ & 0xffffffff;
        if (uVar8 < 0x29) {
          ap[0].gp_offset = ap[0].gp_offset + 8;
          puVar7 = (undefined8 *)(uVar8 + (long)ap[0].reg_save_area);
        }
        else {
          puVar7 = (undefined8 *)ap[0].overflow_arg_area;
          ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_108,(char *)*puVar7,&local_149);
        std::__cxx11::string::append((string *)&finalquery);
        goto LAB_00124a6b;
      }
      if (cVar1 == '\0') {
        RawQuery(__return_storage_ptr__,this,finalquery._M_dataplus._M_p,false);
        std::__cxx11::string::~string((string *)&finalquery);
        return __return_storage_ptr__;
      }
      std::__cxx11::string::push_back((char)&finalquery);
      format = extraout_RDX;
    }
    pcVar9 = pcVar9 + 1;
  } while( true );
}

Assistant:

Database_Result Database::Query(const char *format, ...)
{
	if (!this->connected)
	{
		throw Database_QueryFailed("Not connected to database.");
	}

	std::va_list ap;
	va_start(ap, format);

	std::string finalquery;
	int tempi;
	char *tempc;
	char *escret;
	unsigned long esclen;

	for (const char *p = format; *p != '\0'; ++p)
	{
		if (*p == '#')
		{
			tempi = va_arg(ap,int);
			finalquery += util::to_string(tempi);
		}
		else if (*p == '@')
		{
			tempc = va_arg(ap,char *);
			finalquery += static_cast<std::string>(tempc);
		}
		else if (*p == '$')
		{
			tempc = va_arg(ap,char *);
			switch (this->engine)
			{
#ifdef DATABASE_MYSQL
				case MySQL:
					tempi = strlen(tempc);
					escret = new char[tempi*2+1];
					esclen = mysql_real_escape_string(this->impl->mysql_handle, escret, tempc, tempi);
					finalquery += std::string(escret, esclen);
					delete[] escret;
					break;
#endif // DATABASE_MYSQL

#ifdef DATABASE_SQLITE
				case SQLite:
					escret = sqlite3_mprintf("%q",tempc);
					finalquery += escret;
					sqlite3_free(escret);
					break;
#endif // DATABASE_SQLITE
			}
		}
		else
		{
			finalquery += *p;
		}
	}

	va_end(ap);

	return this->RawQuery(finalquery.c_str());
}